

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClockInference.cpp
# Opt level: O2

bool slang::analysis::ClockInference::isSampledValueFuncCall(Expression *expr)

{
  char *pcVar1;
  undefined4 uVar2;
  uint uVar3;
  undefined1 auVar4 [16];
  KnownSystemName KVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  value_type *elements;
  ulong uVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  byte bVar14;
  undefined1 auVar15 [16];
  
  if (expr->kind != Call) {
    return false;
  }
  KVar5 = ast::CallExpression::getKnownSystemName((CallExpression *)expr);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (long)(int)KVar5;
  uVar7 = SUB168(auVar4 * ZEXT816(0x9e3779b97f4a7c15),8) ^
          SUB168(auVar4 * ZEXT816(0x9e3779b97f4a7c15),0);
  uVar8 = uVar7 >> (SampleValueFuncNames & 0x3f);
  uVar2 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            match_word(unsigned_long)::word)[uVar7 & 0xff];
  uVar10 = 0;
  do {
    pcVar1 = (char *)(DAT_00b8ca88 + uVar8 * 0x10);
    cVar11 = (char)uVar2;
    auVar15[0] = -(*pcVar1 == cVar11);
    cVar12 = (char)((uint)uVar2 >> 8);
    auVar15[1] = -(pcVar1[1] == cVar12);
    cVar13 = (char)((uint)uVar2 >> 0x10);
    auVar15[2] = -(pcVar1[2] == cVar13);
    bVar14 = (byte)((uint)uVar2 >> 0x18);
    auVar15[3] = -(pcVar1[3] == bVar14);
    auVar15[4] = -(pcVar1[4] == cVar11);
    auVar15[5] = -(pcVar1[5] == cVar12);
    auVar15[6] = -(pcVar1[6] == cVar13);
    auVar15[7] = -(pcVar1[7] == bVar14);
    auVar15[8] = -(pcVar1[8] == cVar11);
    auVar15[9] = -(pcVar1[9] == cVar12);
    auVar15[10] = -(pcVar1[10] == cVar13);
    auVar15[0xb] = -(pcVar1[0xb] == bVar14);
    auVar15[0xc] = -(pcVar1[0xc] == cVar11);
    auVar15[0xd] = -(pcVar1[0xd] == cVar12);
    auVar15[0xe] = -(pcVar1[0xe] == cVar13);
    auVar15[0xf] = -(pcVar1[0xf] == bVar14);
    uVar6 = (uint)(ushort)((ushort)(SUB161(auVar15 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe);
    if (uVar6 != 0) {
      do {
        uVar3 = 0;
        if (uVar6 != 0) {
          for (; (uVar6 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
          }
        }
        if (KVar5 == *(KnownSystemName *)(DAT_00b8ca90 + uVar8 * 0x3c + (ulong)uVar3 * 4)) {
          return true;
        }
        uVar6 = uVar6 - 1 & uVar6;
      } while (uVar6 != 0);
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[(uint)uVar7 & 7] & pcVar1[0xf]) == 0) {
      return false;
    }
    lVar9 = uVar8 + uVar10;
    uVar10 = uVar10 + 1;
    uVar8 = lVar9 + 1U & DAT_00b8ca80;
  } while (uVar10 <= DAT_00b8ca80);
  return false;
}

Assistant:

bool ClockInference::isSampledValueFuncCall(const Expression& expr) {
    if (expr.kind == ExpressionKind::Call)
        return SampleValueFuncNames.contains(expr.as<CallExpression>().getKnownSystemName());
    return false;
}